

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

bool cmLocalGeneratorCheckObjectName(string *objName,size_type dir_len,size_type max_total_len)

{
  long lVar1;
  string sStack_68;
  cmCryptoHash md5;
  string md5name;
  
  if (dir_len < max_total_len) {
    if (objName->_M_string_length <= max_total_len - dir_len) {
      return true;
    }
    lVar1 = std::__cxx11::string::find((char)objName,0x2f);
    if (lVar1 != -1) {
      cmCryptoHash::cmCryptoHash(&md5,AlgoMD5);
      std::__cxx11::string::substr((ulong)&sStack_68,(ulong)objName);
      cmCryptoHash::HashString(&md5name,&md5,&sStack_68);
      std::__cxx11::string::~string((string *)&sStack_68);
      std::__cxx11::string::substr((ulong)&sStack_68,(ulong)objName);
      std::__cxx11::string::append((string *)&md5name);
      std::__cxx11::string::~string((string *)&sStack_68);
      std::__cxx11::string::_M_assign((string *)objName);
      std::__cxx11::string::~string((string *)&md5name);
      cmCryptoHash::~cmCryptoHash(&md5);
      return true;
    }
  }
  return false;
}

Assistant:

bool cmLocalGeneratorCheckObjectName(std::string& objName,
                                     std::string::size_type dir_len,
                                     std::string::size_type max_total_len)
{
  // Enforce the maximum file name length if possible.
  std::string::size_type max_obj_len = max_total_len;
  if (dir_len < max_total_len) {
    max_obj_len = max_total_len - dir_len;
    if (objName.size() > max_obj_len) {
      // The current object file name is too long.  Try to shorten it.
      return cmLocalGeneratorShortenObjectName(objName, max_obj_len);
    }
    // The object file name is short enough.
    return true;
  }
  // The build directory in which the object will be stored is
  // already too deep.
  return false;
}